

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int set_parts(void)

{
  int iVar1;
  CURLU *u;
  CURLU *urlp;
  char *url;
  CURLUcode local_10;
  int error;
  CURLUcode rc;
  int i;
  
  url._4_4_ = 0;
  error = 0;
  while( true ) {
    if (set_parts_list[error].set == (char *)0x0 || url._4_4_ != 0) {
      return url._4_4_;
    }
    urlp = (CURLU *)0x0;
    u = (CURLU *)curl_url();
    if (u == (CURLU *)0x0) break;
    if (set_parts_list[error].in == (char *)0x0) {
      local_10 = CURLUE_OK;
    }
    else {
      local_10 = curl_url_set(u,0,set_parts_list[error].in,set_parts_list[error].urlflags);
    }
    if (local_10 == CURLUE_OK) {
      updateurl(u,set_parts_list[error].set,set_parts_list[error].setflags);
      local_10 = curl_url_get(u,0,&urlp);
      if (local_10 == CURLUE_OK) {
        iVar1 = checkurl((char *)urlp,set_parts_list[error].out);
        if (iVar1 != 0) {
          url._4_4_ = url._4_4_ + 1;
        }
      }
      else {
        curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1560.c"
                      ,0x27b,local_10);
        url._4_4_ = url._4_4_ + 1;
      }
    }
    else if (local_10 != set_parts_list[error].ucode) {
      curl_mfprintf(_stderr,"Set parts\nin: %s\nreturned %d (expected %d)\n",
                    set_parts_list[error].in,local_10,set_parts_list[error].ucode);
      url._4_4_ = url._4_4_ + 1;
    }
    curl_free(urlp);
    curl_url_cleanup(u);
    error = error + 1;
  }
  return url._4_4_ + 1;
}

Assistant:

static int set_parts(void)
{
  int i;
  CURLUcode rc;
  int error = 0;

  for(i = 0; set_parts_list[i].set && !error; i++) {
    char *url = NULL;
    CURLU *urlp = curl_url();
    if(!urlp) {
      error++;
      break;
    }
    if(set_parts_list[i].in)
      rc = curl_url_set(urlp, CURLUPART_URL, set_parts_list[i].in,
                        set_parts_list[i].urlflags);
    else
      rc = CURLUE_OK;
    if(!rc) {
      updateurl(urlp, set_parts_list[i].set, set_parts_list[i].setflags);
      rc = curl_url_get(urlp, CURLUPART_URL, &url, 0);

      if(rc) {
        fprintf(stderr, "%s:%d Get URL returned %d\n",
                __FILE__, __LINE__, (int)rc);
        error++;
      }
      else if(checkurl(url, set_parts_list[i].out)) {
        error++;
      }
    }
    else if(rc != set_parts_list[i].ucode) {
      fprintf(stderr, "Set parts\nin: %s\nreturned %d (expected %d)\n",
              set_parts_list[i].in, (int)rc, set_parts_list[i].ucode);
      error++;
    }
    curl_free(url);
    curl_url_cleanup(urlp);
  }
  return error;
}